

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O0

ostream * detail::operator<<(ostream *os,print_hex_string *s)

{
  ostream *this;
  long *in_RSI;
  ostream *in_RDI;
  size_t i;
  char oldfill;
  fmtflags old;
  fmtflags in_stack_ffffffffffffffd8;
  _Setw in_stack_ffffffffffffffdc;
  ios_base *this_00;
  
  std::ios_base::flags
            ((ios_base *)
             ((long)&in_RDI->_vptr_basic_ostream + (long)in_RDI->_vptr_basic_ostream[-3]));
  std::ios::fill((char)in_RDI + (char)in_RDI->_vptr_basic_ostream[-3]);
  std::ostream::operator<<(in_RDI,std::hex);
  for (this_00 = (ios_base *)0x0; this_00 < (ios_base *)in_RSI[1]; this_00 = this_00 + 1) {
    in_stack_ffffffffffffffdc = std::setprecision(2);
    this = std::operator<<(in_RDI,in_stack_ffffffffffffffdc);
    std::ostream::operator<<(this,(uint)(byte)this_00[*in_RSI]);
  }
  std::ios::fill((char)in_RDI + (char)in_RDI->_vptr_basic_ostream[-3]);
  std::ios_base::setf(this_00,in_stack_ffffffffffffffdc._M_n,in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline std::ostream & operator<<(std::ostream & os, const print_hex_string & s) {
	
	std::ios_base::fmtflags old = os.flags();
	char oldfill = os.fill('0');
	
	os << std::hex;
	for(size_t i = 0; i < s.size; i++) {
		os << std::setw(2) << int(boost::uint8_t(s.data[i]));
	}
	
	os.fill(oldfill);
	os.setf(old, std::ios_base::basefield);
	return os;
}